

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::resize(Application *this,size_t w,size_t h)

{
  this->screenW = w;
  this->screenH = h;
  Camera::set_screen_size(&this->camera,w,h);
  OSDText::resize(&this->textManager,w,h);
  set_projection_matrix(this);
  if (*(int *)&(this->super_Renderer).field_0xc != 0) {
    PathTracer::set_frame_size(this->pathtracer,w,h);
  }
  Timeline::resize(&this->timeline,(int)w,0x40);
  Timeline::move(&this->timeline,0,(int)h + -0x40);
  return;
}

Assistant:

void Application::resize(size_t w, size_t h) {
  screenW = w;
  screenH = h;
  camera.set_screen_size(w, h);
  textManager.resize(w, h);
  set_projection_matrix();
  if (mode != MODEL_MODE) {
    pathtracer->set_frame_size(w, h);
  }
  timeline.resize(w, 64);
  timeline.move(0, h - 64);
}